

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GraphCycles(GraphCycles *this)

{
  Rep *this_00;
  GraphCycles *this_local;
  
  anon_unknown_0::InitArenaIfNecessary();
  this_00 = (Rep *)base_internal::LowLevelAlloc::AllocWithArena
                             (0x100168,(anonymous_namespace)::arena);
  Rep::Rep(this_00);
  this->rep_ = this_00;
  return;
}

Assistant:

GraphCycles::GraphCycles() {
  InitArenaIfNecessary();
  rep_ = new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Rep), arena))
      Rep;
}